

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sealwrap.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Sealwrap::start_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Sealwrap *this)

{
  Client *client;
  unordered_map<_e0ce3516_> local_78;
  Url local_38;
  Sealwrap *local_18;
  Sealwrap *this_local;
  
  client = *(Client **)this;
  local_18 = this;
  this_local = (Sealwrap *)__return_storage_ptr__;
  getUrl_abi_cxx11_(&local_38,this);
  local_78._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_78._M_h._M_rehash_policy._4_4_ = 0;
  local_78._M_h._M_rehash_policy._M_next_resize = 0;
  local_78._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78._M_h._M_element_count = 0;
  local_78._M_h._M_buckets = (__buckets_ptr)0x0;
  local_78._M_h._M_bucket_count = 0;
  local_78._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_map<$e0ce3516$>::unordered_map(&local_78);
  HttpConsumer::post(__return_storage_ptr__,client,&local_38,&local_78);
  std::unordered_map<$e0ce3516$>::~unordered_map(&local_78);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::Sealwrap::start() {
  return HttpConsumer::post(client_, getUrl(), Parameters{});
}